

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
argparse::Argument::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Argument *this)

{
  any *__any;
  long *plVar1;
  logic_error *this_00;
  
  __any = (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (__any == (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_finish) {
    if ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"No value provided");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    plVar1 = (long *)std::__any_caster<std::__cxx11::string>(&this->mDefaultValue);
  }
  else {
    plVar1 = (long *)std::__any_caster<std::__cxx11::string>(__any);
  }
  if (plVar1 != (long *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar1,plVar1[1] + *plVar1);
    return __return_storage_ptr__;
  }
  std::__throw_bad_any_cast();
}

Assistant:

T get() const {
    if (!mValues.empty()) {
      if constexpr (details::is_container_v<T>)
        return any_cast_container<T>(mValues);
      else
        return std::any_cast<T>(mValues.front());
    }
    if (mDefaultValue.has_value()) {
      return std::any_cast<T>(mDefaultValue);
    }
    throw std::logic_error("No value provided");
  }